

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSString * js_alloc_string(JSContext *ctx,int max_len,int is_wide_char)

{
  JSString *pJVar1;
  
  pJVar1 = js_alloc_string_rt(ctx->rt,max_len,is_wide_char);
  if (pJVar1 == (JSString *)0x0) {
    JS_ThrowOutOfMemory(ctx);
  }
  return pJVar1;
}

Assistant:

static JSString *js_alloc_string(JSContext *ctx, int max_len, int is_wide_char)
{
    JSString *p;
    p = js_alloc_string_rt(ctx->rt, max_len, is_wide_char);
    if (unlikely(!p)) {
        JS_ThrowOutOfMemory(ctx);
        return NULL;
    }
    return p;
}